

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_json_mapping_base.h
# Opt level: O3

vector<cfd::js::api::FundSelectUtxoDataStruct,_std::allocator<cfd::js::api::FundSelectUtxoDataStruct>_>
* __thiscall
cfd::core::
JsonObjectVector<cfd::js::api::json::FundSelectUtxoData,_cfd::js::api::FundSelectUtxoDataStruct>::
ConvertToStruct(vector<cfd::js::api::FundSelectUtxoDataStruct,_std::allocator<cfd::js::api::FundSelectUtxoDataStruct>_>
                *__return_storage_ptr__,
               JsonObjectVector<cfd::js::api::json::FundSelectUtxoData,_cfd::js::api::FundSelectUtxoDataStruct>
               *this)

{
  pointer pFVar1;
  pointer this_00;
  FundSelectUtxoDataStruct data;
  FundSelectUtxoDataStruct local_170;
  
  (__return_storage_ptr__->
  super__Vector_base<cfd::js::api::FundSelectUtxoDataStruct,_std::allocator<cfd::js::api::FundSelectUtxoDataStruct>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<cfd::js::api::FundSelectUtxoDataStruct,_std::allocator<cfd::js::api::FundSelectUtxoDataStruct>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<cfd::js::api::FundSelectUtxoDataStruct,_std::allocator<cfd::js::api::FundSelectUtxoDataStruct>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = (this->super_JsonVector<cfd::js::api::json::FundSelectUtxoData>).
            super_vector<cfd::js::api::json::FundSelectUtxoData,_std::allocator<cfd::js::api::json::FundSelectUtxoData>_>
            .
            super__Vector_base<cfd::js::api::json::FundSelectUtxoData,_std::allocator<cfd::js::api::json::FundSelectUtxoData>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pFVar1 = (this->super_JsonVector<cfd::js::api::json::FundSelectUtxoData>).
           super_vector<cfd::js::api::json::FundSelectUtxoData,_std::allocator<cfd::js::api::json::FundSelectUtxoData>_>
           .
           super__Vector_base<cfd::js::api::json::FundSelectUtxoData,_std::allocator<cfd::js::api::json::FundSelectUtxoData>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (this_00 != pFVar1) {
    do {
      js::api::json::FundSelectUtxoData::ConvertToStruct(&local_170,this_00);
      std::
      vector<cfd::js::api::FundSelectUtxoDataStruct,_std::allocator<cfd::js::api::FundSelectUtxoDataStruct>_>
      ::push_back(__return_storage_ptr__,&local_170);
      js::api::FundSelectUtxoDataStruct::~FundSelectUtxoDataStruct(&local_170);
      this_00 = this_00 + 1;
    } while (this_00 != pFVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<STRUCT_TYPE> ConvertToStruct() const {
    std::vector<STRUCT_TYPE> result;
    for (const auto& element : *this) {
      STRUCT_TYPE data = element.ConvertToStruct();
      result.push_back(data);
    }
    return result;
  }